

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

void __thiscall AixLog::Metadata::Metadata(Metadata *this)

{
  this->severity = trace;
  (this->tag)._vptr_Tag = (_func_int **)&PTR__Tag_001eaf88;
  (this->tag).text._M_dataplus._M_p = (pointer)&(this->tag).text.field_2;
  (this->tag).text._M_string_length = 0;
  (this->tag).text.field_2._M_local_buf[0] = '\0';
  (this->tag).is_null_ = true;
  Function::Function(&this->function,(nullptr_t)0x0);
  (this->timestamp)._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001eaf58;
  (this->timestamp).time_point.__d.__r = 0;
  (this->timestamp).is_null_ = true;
  return;
}

Assistant:

Metadata()
      : severity(Severity::trace),
        tag(nullptr),
        function(nullptr),
        timestamp(nullptr) {}